

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,WriteStream *w)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CodePrinter *pCVar2;
  string *psVar3;
  Expression *e;
  size_t sVar4;
  string_view text;
  string_view text_00;
  char s [2];
  char local_52 [2];
  string local_50;
  
  pCVar2 = this->out;
  text._M_str = "write ";
  text._M_len = 6;
  choc::text::CodePrinter::writeBlock(pCVar2,text);
  psVar3 = (((w->target).object)->super_IODeclaration).name.name;
  if (psVar3 == (string *)0x0) {
    throwInternalCompilerError("isValid()","toString",0x23);
  }
  text_00._M_str = (psVar3->_M_dataplus)._M_p;
  text_00._M_len = psVar3->_M_string_length;
  choc::text::CodePrinter::writeBlock(pCVar2,text_00);
  if ((w->element).object != (Expression *)0x0) {
    pCVar2 = this->out;
    local_52[0] = '[';
    local_52[1] = '\0';
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(local_52);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4);
    choc::text::CodePrinter::append(pCVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    e = (w->element).object;
    if (e == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    printExpression(this,e);
    pCVar2 = this->out;
    local_52[0] = ']';
    local_52[1] = '\0';
    local_50._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(local_52);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4);
    choc::text::CodePrinter::append(pCVar2,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar2 = this->out;
  local_52[0] = ' ';
  local_52[1] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar4 = strlen(local_52);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4);
  choc::text::CodePrinter::append(pCVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  printExpression(this,(w->value).object);
  return;
}

Assistant:

void printDescription (const heart::WriteStream& w)
        {
            out << "write " << w.target->name.toString();

            if (w.element != nullptr)
            {
                out << '[';
                printExpression (*w.element);
                out << ']';
            }

            out << ' ';
            printExpression (w.value);
        }